

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,Token *args_3,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_4,Token *args_5)

{
  Token semi;
  Token typedefKeyword;
  Token name;
  TypedefDeclarationSyntax *pTVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  Info *in_RDI;
  long in_R8;
  TypedefDeclarationSyntax *in_R9;
  undefined8 unaff_retaddr;
  Info *in_stack_00000008;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pTVar1 = (TypedefDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  typedefKeyword.info = in_RCX;
  typedefKeyword.kind = (short)in_R8;
  typedefKeyword._2_1_ = (char)((ulong)in_R8 >> 0x10);
  typedefKeyword.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  typedefKeyword.rawLen = (int)((ulong)in_R8 >> 0x20);
  name.info = in_RDI;
  name.kind = (short)in_RSI;
  name._2_1_ = (char)((ulong)in_RSI >> 0x10);
  name.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  name.rawLen = (int)((ulong)in_RSI >> 0x20);
  semi.info = in_stack_00000008;
  semi.kind = (short)unaff_retaddr;
  semi._2_1_ = (char)((ulong)unaff_retaddr >> 0x10);
  semi.numFlags.raw = (char)((ulong)unaff_retaddr >> 0x18);
  semi.rawLen = (int)((ulong)unaff_retaddr >> 0x20);
  slang::syntax::TypedefDeclarationSyntax::TypedefDeclarationSyntax
            (in_R9,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDX[1],typedefKeyword,
             (DataTypeSyntax *)*in_RDX,name,
             *(SyntaxList<slang::syntax::VariableDimensionSyntax> **)(in_R8 + 8),semi);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }